

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

wchar_t Term_get_first_tile_row(term *t)

{
  int local_18;
  wchar_t local_14;
  wchar_t i;
  wchar_t result;
  term *t_local;
  
  if (t == angband_term[0]) {
    local_14 = row_top_map[Term->sidebar_mode];
  }
  else {
    for (local_18 = 1; local_18 < 8; local_18 = local_18 + 1) {
      if (t == angband_term[local_18]) {
        local_14 = (wchar_t)((window_flag[local_18] & 0x80) == 0);
        return local_14;
      }
    }
    local_14 = L'\x01';
  }
  return local_14;
}

Assistant:

int Term_get_first_tile_row(term *t)
{
	int result;

	if (t == angband_term[0]) {
		/*
		 * In the main window, there's no tiles in the top bar, does
		 * not account for the case where the main window is used as
		 * the target for display_map() or displays tiles in the
		 * knowledge menus.
		 */
		result = ROW_MAP;
	} else {
		/* In other windows, have to check the flags. */
		int i = 1;

		while (1) {
			if (i >= ANGBAND_TERM_MAX) {
				/*
				 * Don't know the flags.  Err on the side of
				 * drawing too few tiles.
				 */
				result = 1;
				break;
			}
			if (t == angband_term[i]) {
				if (window_flag[i] & PW_OVERHEAD) {
					/*
					 * All rows are valid targets for
					 * tiles.
					 */
					result = 0;
				} else {
					/*
					 * It's presumably a minimap view where
					 * the first row has a non-tile border.
					 */
					result = 1;
				}
				break;
			}
			++i;
		}
	}
	return result;
}